

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::compare_not_equal(Simulator *this,PCode *code)

{
  double dVar1;
  int iVar2;
  Type TVar3;
  reference pvVar4;
  int *piVar5;
  double *pdVar6;
  deque<StackSymbol,_std::allocator<StackSymbol>_> *this_00;
  uint local_1f4;
  StackSymbol local_1f0;
  uint local_1a4;
  StackSymbol local_1a0;
  uint local_154;
  StackSymbol local_150;
  uint local_104;
  StackSymbol local_100;
  undefined1 local_a8 [8];
  StackSymbol left;
  StackSymbol right;
  PCode *code_local;
  Simulator *this_local;
  
  this_00 = &this->stack_;
  pvVar4 = std::deque<StackSymbol,_std::allocator<StackSymbol>_>::back(this_00);
  StackSymbol::StackSymbol
            ((StackSymbol *)
             &left.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pvVar4);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(this_00);
  pvVar4 = std::deque<StackSymbol,_std::allocator<StackSymbol>_>::back(this_00);
  StackSymbol::StackSymbol((StackSymbol *)local_a8,pvVar4);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(&this->stack_);
  TVar3 = StackSymbol::type((StackSymbol *)local_a8);
  if (TVar3 == kInt) {
    TVar3 = StackSymbol::type((StackSymbol *)
                              &left.value_.real_array.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
    if (TVar3 == kInt) {
      piVar5 = StackSymbol::int_value((StackSymbol *)local_a8);
      iVar2 = *piVar5;
      piVar5 = StackSymbol::int_value
                         ((StackSymbol *)
                          &left.value_.real_array.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      local_104 = (uint)(iVar2 != *piVar5);
      StackSymbol::StackSymbol(&local_100,(int *)&local_104);
      std::deque<StackSymbol,_std::allocator<StackSymbol>_>::push_back(&this->stack_,&local_100);
      StackSymbol::~StackSymbol(&local_100);
    }
    else {
      piVar5 = StackSymbol::int_value((StackSymbol *)local_a8);
      iVar2 = *piVar5;
      pdVar6 = StackSymbol::real_value
                         ((StackSymbol *)
                          &left.value_.real_array.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      local_154 = -(uint)((double)iVar2 != *pdVar6) & 1;
      StackSymbol::StackSymbol(&local_150,(int *)&local_154);
      std::deque<StackSymbol,_std::allocator<StackSymbol>_>::push_back(&this->stack_,&local_150);
      StackSymbol::~StackSymbol(&local_150);
    }
  }
  else {
    TVar3 = StackSymbol::type((StackSymbol *)
                              &left.value_.real_array.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
    if (TVar3 == kInt) {
      pdVar6 = StackSymbol::real_value((StackSymbol *)local_a8);
      dVar1 = *pdVar6;
      piVar5 = StackSymbol::int_value
                         ((StackSymbol *)
                          &left.value_.real_array.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      local_1a4 = -(uint)(dVar1 != (double)*piVar5) & 1;
      StackSymbol::StackSymbol(&local_1a0,(int *)&local_1a4);
      std::deque<StackSymbol,_std::allocator<StackSymbol>_>::push_back(&this->stack_,&local_1a0);
      StackSymbol::~StackSymbol(&local_1a0);
    }
    else {
      pdVar6 = StackSymbol::real_value((StackSymbol *)local_a8);
      dVar1 = *pdVar6;
      pdVar6 = StackSymbol::real_value
                         ((StackSymbol *)
                          &left.value_.real_array.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      local_1f4 = -(uint)(dVar1 != *pdVar6) & 1;
      StackSymbol::StackSymbol(&local_1f0,(int *)&local_1f4);
      std::deque<StackSymbol,_std::allocator<StackSymbol>_>::push_back(&this->stack_,&local_1f0);
      StackSymbol::~StackSymbol(&local_1f0);
    }
  }
  inc_eip(this);
  StackSymbol::~StackSymbol((StackSymbol *)local_a8);
  StackSymbol::~StackSymbol
            ((StackSymbol *)
             &left.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Simulator::compare_not_equal(const PCode &code) {
    StackSymbol right = stack_.back();
    stack_.pop_back();
    StackSymbol left = stack_.back();
    stack_.pop_back();

    if (left.type() == StackSymbol::Type::kInt) {
        if (right.type() == StackSymbol::Type::kInt) {
            stack_.push_back(StackSymbol((int)(left.int_value() != right.int_value())));
        } else {
            stack_.push_back(StackSymbol((int)((double)left.int_value() != right.real_value())));
        }
    } else {
        if (right.type() == StackSymbol::Type::kInt) {
            stack_.push_back(StackSymbol((int)(left.real_value() != (double)right.int_value())));
        } else {
            stack_.push_back(StackSymbol((int)(left.real_value() != right.real_value())));
        }
    }

    inc_eip();
}